

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O3

bool __thiscall FOptionMenuItemColorPicker::Activate(FOptionMenuItemColorPicker *this)

{
  DMenu *menu;
  FSoundID local_c;
  
  if (this->mCVar == (FColorCVar *)0x0) {
    return false;
  }
  local_c.ID = S_FindSound("menu/choose");
  S_Sound(0x22,&local_c,snd_menuvolume.Value,0.0);
  menu = StartPickerMenu(DMenu::CurrentMenu,(this->super_FOptionMenuItem).mLabel.Chars,this->mCVar);
  if (menu != (DMenu *)0x0) {
    M_ActivateMenu(menu);
  }
  return menu != (DMenu *)0x0;
}

Assistant:

bool Activate()
	{
		if (mCVar != NULL)
		{
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
			DMenu *picker = StartPickerMenu(DMenu::CurrentMenu, mLabel, mCVar);
			if (picker != NULL)
			{
				M_ActivateMenu(picker);
				return true;
			}
		}
		return false;
	}